

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doh.c
# Opt level: O1

Curl_addrinfo * Curl_doh(Curl_easy *data,char *hostname,int port,int *waitp)

{
  undefined1 *puVar1;
  uchar *puVar2;
  connectdata *pcVar3;
  _Bool _Var4;
  CURLcode CVar5;
  doh_probes *pdVar6;
  long lVar7;
  curl_slist *headers;
  
  pcVar3 = data->conn;
  *waitp = 0;
  pdVar6 = (doh_probes *)(*Curl_ccalloc)(1,0x488);
  (data->req).doh = pdVar6;
  if (pdVar6 == (doh_probes *)0x0) {
    return (Curl_addrinfo *)0x0;
  }
  lVar7 = 8;
  do {
    puVar2 = pdVar6->probe[0].req_body + lVar7 + -0x14;
    puVar2[0] = 0xff;
    puVar2[1] = 0xff;
    puVar2[2] = 0xff;
    puVar2[3] = 0xff;
    puVar2[4] = 0xff;
    puVar2[5] = 0xff;
    puVar2[6] = 0xff;
    puVar2[7] = 0xff;
    lVar7 = lVar7 + 0x238;
  } while (lVar7 == 0x240);
  puVar1 = &(pcVar3->bits).field_0x3;
  *puVar1 = *puVar1 | 2;
  pdVar6->host = hostname;
  pdVar6->port = port;
  headers = curl_slist_append((curl_slist *)0x0,"Content-Type: application/dns-message");
  pdVar6->req_hds = headers;
  if ((headers != (curl_slist *)0x0) &&
     (CVar5 = doh_run_probe(data,pdVar6->probe,DNS_TYPE_A,hostname,(data->set).str[0x3f],data->multi
                            ,headers), CVar5 == CURLE_OK)) {
    pdVar6->pending = pdVar6->pending + 1;
    if ((pcVar3->ip_version != '\x01') && (_Var4 = Curl_ipv6works(data), _Var4)) {
      CVar5 = doh_run_probe(data,pdVar6->probe + 1,DNS_TYPE_AAAA,hostname,(data->set).str[0x3f],
                            data->multi,pdVar6->req_hds);
      if (CVar5 != CURLE_OK) goto LAB_00123503;
      pdVar6->pending = pdVar6->pending + 1;
    }
    *waitp = 1;
    return (Curl_addrinfo *)0x0;
  }
LAB_00123503:
  Curl_doh_cleanup(data);
  return (Curl_addrinfo *)0x0;
}

Assistant:

struct Curl_addrinfo *Curl_doh(struct Curl_easy *data,
                               const char *hostname,
                               int port,
                               int *waitp)
{
  CURLcode result = CURLE_OK;
  struct doh_probes *dohp;
  struct connectdata *conn = data->conn;
  size_t i;
#ifdef USE_HTTPSRR
  /* for now, this is only used when ECH is enabled */
# ifdef USE_ECH
  char *qname = NULL;
# endif
#endif
  *waitp = FALSE;
  (void)hostname;
  (void)port;

  DEBUGASSERT(!data->req.doh);
  DEBUGASSERT(conn);

  /* start clean, consider allocating this struct on demand */
  dohp = data->req.doh = calloc(1, sizeof(struct doh_probes));
  if(!dohp)
    return NULL;

  for(i = 0; i < DOH_SLOT_COUNT; ++i) {
    dohp->probe[i].easy_mid = -1;
  }

  conn->bits.doh = TRUE;
  dohp->host = hostname;
  dohp->port = port;
  dohp->req_hds =
    curl_slist_append(NULL,
                      "Content-Type: application/dns-message");
  if(!dohp->req_hds)
    goto error;

  /* create IPv4 DoH request */
  result = doh_run_probe(data, &dohp->probe[DOH_SLOT_IPV4],
                         DNS_TYPE_A, hostname, data->set.str[STRING_DOH],
                         data->multi, dohp->req_hds);
  if(result)
    goto error;
  dohp->pending++;

#ifdef USE_IPV6
  if((conn->ip_version != CURL_IPRESOLVE_V4) && Curl_ipv6works(data)) {
    /* create IPv6 DoH request */
    result = doh_run_probe(data, &dohp->probe[DOH_SLOT_IPV6],
                           DNS_TYPE_AAAA, hostname, data->set.str[STRING_DOH],
                           data->multi, dohp->req_hds);
    if(result)
      goto error;
    dohp->pending++;
  }
#endif

#ifdef USE_HTTPSRR
  /*
   * TODO: Figure out the conditions under which we want to make
   * a request for an HTTPS RR when we are not doing ECH. For now,
   * making this request breaks a bunch of DoH tests, e.g. test2100,
   * where the additional request does not match the pre-cooked data
   * files, so there is a bit of work attached to making the request
   * in a non-ECH use-case. For the present, we will only make the
   * request when ECH is enabled in the build and is being used for
   * the curl operation.
   */
# ifdef USE_ECH
  if(data->set.tls_ech & CURLECH_ENABLE
     || data->set.tls_ech & CURLECH_HARD) {
    if(port == 443)
      qname = strdup(hostname);
    else
      qname = aprintf("_%d._https.%s", port, hostname);
    if(!qname)
      goto error;
    result = doh_run_probe(data, &dohp->probe[DOH_SLOT_HTTPS_RR],
                           DNS_TYPE_HTTPS, qname, data->set.str[STRING_DOH],
                           data->multi, dohp->req_hds);
    Curl_safefree(qname);
    if(result)
      goto error;
    dohp->pending++;
  }
# endif
#endif
  *waitp = TRUE; /* this never returns synchronously */
  return NULL;

error:
  Curl_doh_cleanup(data);
  return NULL;
}